

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall value_int::test_method(value_int *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d0;
  basic_cstring<const_char> local_4b0;
  assertion_result local_4a0;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  basic_cstring<const_char> local_468;
  output_test_stream local_458 [8];
  output_test_stream output_1;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2b8;
  basic_cstring<const_char> local_298;
  assertion_result local_288;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  output_test_stream local_240 [8];
  output_test_stream output;
  basic_cstring<const_char> local_c0;
  basic_cstring<const_char> local_b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a0;
  assertion_result local_80;
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58 [2];
  Value local_38 [8];
  Value value;
  Value local_28 [8];
  Value value1;
  int local_14;
  value_int *pvStack_10;
  int aint1;
  value_int *this_local;
  
  local_14 = 5;
  pvStack_10 = this;
  dynamicgraph::command::Value::Value(local_28,&local_14);
  dynamicgraph::command::Value::Value(local_38,local_28);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_68);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_58,0xcf,&local_68);
    bVar2 = dynamicgraph::command::Value::operator==(local_28,local_38);
    boost::test_tools::assertion_result::assertion_result(&local_80,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,"value1 == value",0xf);
    boost::unit_test::operator<<(&local_a0,plVar4,&local_b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_80,&local_a0,&local_c0,0xcf,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a0);
    boost::test_tools::assertion_result::~assertion_result(&local_80);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_250);
  boost::test_tools::output_test_stream::output_test_stream(local_240,&local_250,1);
  dynamicgraph::command::operator<<((ostream *)local_240,local_28);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0xd4,&local_270);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_298,"Type=int, value=5");
    boost::test_tools::output_test_stream::is_equal(&local_288,local_240,&local_298,1);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,"output.is_equal(\"Type=int, value=5\")",0x24);
    boost::unit_test::operator<<(&local_2b8,plVar4,&local_2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_288,&local_2b8,&local_2d8,0xd4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2b8);
    boost::test_tools::assertion_result::~assertion_result(&local_288);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_240);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_468);
  boost::test_tools::output_test_stream::output_test_stream(local_458,&local_468,1);
  dynamicgraph::command::operator<<((ostream *)local_458,local_38);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_488);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_478,0xda,&local_488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4b0,"Type=int, value=5");
    boost::test_tools::output_test_stream::is_equal(&local_4a0,local_458,&local_4b0,1);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,"output.is_equal(\"Type=int, value=5\")",0x24);
    boost::unit_test::operator<<(&local_4d0,plVar4,&local_4e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_4a0,&local_4d0,&local_4f0,0xda,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4d0);
    boost::test_tools::assertion_result::~assertion_result(&local_4a0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_458);
  dynamicgraph::command::Value::~Value(local_38);
  dynamicgraph::command::Value::~Value(local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_int) {
  using dg::command::Value;

  int aint1(5);
  Value value1(aint1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=int, value=5"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=int, value=5"));
  }
}